

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O0

Error __thiscall asmjit::v1_14::CodeHolder::reserveBuffer(CodeHolder *this,CodeBuffer *cb,size_t n)

{
  bool bVar1;
  ulong in_RDX;
  CodeHolder *in_RSI;
  size_t capacity;
  Error local_24;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 uVar2;
  CodeHolder *self;
  
  if (*(ulong *)&in_RSI->field_0x10 < in_RDX) {
    uVar2 = 2;
    self = in_RSI;
    bVar1 = Support::test<asmjit::v1_14::CodeBufferFlags,asmjit::v1_14::CodeBufferFlags>
                      (*(CodeBufferFlags *)&in_RSI->field_0x18,kIsFixed);
    if (bVar1) {
      local_24 = DebugUtils::errored(9);
    }
    else {
      local_24 = CodeHolder_reserveInternal
                           (self,(CodeBuffer *)CONCAT44(uVar2,in_stack_fffffffffffffff0),
                            (size_t)in_RSI);
    }
  }
  else {
    local_24 = 0;
  }
  return local_24;
}

Assistant:

Error CodeHolder::reserveBuffer(CodeBuffer* cb, size_t n) noexcept {
  size_t capacity = cb->capacity();

  if (n <= capacity)
    return kErrorOk;

  if (cb->isFixed())
    return DebugUtils::errored(kErrorTooLarge);

  return CodeHolder_reserveInternal(this, cb, n);
}